

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

Clause * __thiscall CaDiCaL::Internal::new_driving_clause(Internal *this,int glue,int *jump)

{
  uint uVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  uint uVar2;
  ulong uVar3;
  Clause *pCVar4;
  
  __first._M_current =
       (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  __last._M_current =
       (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  uVar3 = (long)__last._M_current - (long)__first._M_current >> 2;
  if (uVar3 == 1) {
    this->iterating = true;
  }
  else if (uVar3 != 0) {
    if ((ulong)(long)(this->opts).radixsortlim < uVar3) {
      rsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,CaDiCaL::analyze_trail_negative_rank>
                (__first,__last,(analyze_trail_negative_rank)this);
    }
    else {
      std::
      __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::analyze_trail_larger>>
                (__first,__last,(_Iter_comp_iter<CaDiCaL::analyze_trail_larger>)this);
    }
    uVar1 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[1];
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    *jump = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2].level;
    pCVar4 = new_learned_redundant_clause(this,glue);
    *(uint *)&pCVar4->field_0x8 =
         (uint)(glue <= (this->opts).reducetier2glue) * 0x4000 +
         (*(uint *)&pCVar4->field_0x8 & 0xffff3fff) + 0x4000;
    return pCVar4;
  }
  *jump = 0;
  return (Clause *)0x0;
}

Assistant:

Clause *Internal::new_driving_clause (const int glue, int &jump) {

  const size_t size = clause.size ();
  Clause *res;

  if (!size) {

    jump = 0;
    res = 0;

  } else if (size == 1) {

    iterating = true;
    jump = 0;
    res = 0;

  } else {

    assert (clause.size () > 1);

    // We have to get the last assigned literals into the watch position.
    // Sorting all literals with respect to reverse assignment order is
    // overkill but seems to get slightly faster run-time.  For 'minimize'
    // we sort the literals too heuristically along the trail order (so in
    // the opposite order) with the hope to hit the recursion limit less
    // frequently.  Thus sorting effort is doubled here.
    //
    MSORT (opts.radixsortlim, clause.begin (), clause.end (),
           analyze_trail_negative_rank (this), analyze_trail_larger (this));

    jump = var (clause[1]).level;
    res = new_learned_redundant_clause (glue);
    res->used = 1 + (glue <= opts.reducetier2glue);
  }

  LOG ("jump level %d", jump);

  return res;
}